

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  int iVar29;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int j_00;
  uint uVar30;
  uint uVar31;
  uint uVar34;
  uint uVar35;
  ulong uVar32;
  ulong uVar33;
  uint uVar36;
  uint uVar37;
  int iVar40;
  uint uVar41;
  uint uVar42;
  ulong uVar38;
  ulong uVar39;
  int iVar43;
  int iVar46;
  int iVar47;
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i vWH_00;
  int in_stack_fffffffffffff4f8;
  int local_b04;
  int local_af0;
  int local_aec;
  int local_ad8;
  int local_ad4;
  int local_ac0;
  int local_abc;
  int local_aac;
  int local_aa8;
  int local_aa4;
  longlong *plStack_aa0;
  int32_t k;
  int32_t *j_1;
  int32_t *i_1;
  int32_t *t;
  __m128i cond_Jlt;
  __m128i cond_all;
  __m128i cond_max;
  __m128i cond_eq;
  __m128i cond_valid_IJ;
  __m128i cond_valid_J;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  __m128i vIltLimit;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vJLimit;
  __m128i vILimit;
  __m128i vEndJ;
  __m128i vEndI;
  __m128i vMaxH;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vN;
  __m128i vOne;
  __m128i vZero;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf0;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  uint local_83c;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  int local_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_100;
  int iStack_fc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  
  s2B = (int32_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_sse41_128_32","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_diag_sse41_128_32","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_diag_sse41_128_32","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_diag_sse41_128_32","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_sse41_128_32","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_diag_sse41_128_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_diag_sse41_128_32","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_aa8 = _s1Len;
    if (matrix->type != 0) {
      local_aa8 = matrix->length;
    }
    NEG_LIMIT = 0;
    POS_LIMIT = 0;
    if (-open < matrix->min) {
      local_aac = open + -0x80000000;
    }
    else {
      local_aac = -0x80000000 - matrix->min;
    }
    uVar28 = local_aac + 1;
    iVar29 = 0x7ffffffe - matrix->max;
    vNegInf[1] = CONCAT44(uVar28,uVar28);
    vSaturationCheckMax[0] = CONCAT44(uVar28,uVar28);
    vSaturationCheckMax[1] = CONCAT44(iVar29,iVar29);
    vSaturationCheckMin[0] = CONCAT44(iVar29,iVar29);
    uVar10 = CONCAT44(uVar28,uVar28);
    uVar11 = CONCAT44(uVar28,uVar28);
    auVar9._8_8_ = uVar11;
    auVar9._0_8_ = uVar10;
    vJreset[1] = 0x200000003;
    vI[0] = 1;
    vMaxH[0] = uVar11;
    vEndI[1] = uVar10;
    vEndI[0] = uVar11;
    vEndJ[1] = uVar10;
    vEndJ[0] = uVar11;
    vILimit[1] = uVar10;
    vILimit[0] = CONCAT44(local_aa8,local_aa8);
    j_00 = gap;
    _s1_local = (char *)parasail_result_new_table1(local_aa8,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x4401004;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_01 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      if (ptr == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2B = parasail_memalign_int32_t(0x10,(long)(local_aa8 + 3));
          if (s2B == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (end_query = 0; end_query < local_aa8; end_query = end_query + 1) {
            s2B[end_query] = matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_aa8; end_query < local_aa8 + 3; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr[(long)end_ref + 3] = 0;
          iVar1 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = 0;
          ptr_01[(long)end_ref + 3] = uVar28;
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = uVar28;
          ptr_01[(long)end_ref + 3] = uVar28;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr_00[(long)end_ref + 3] = uVar28;
          ptr_01[(long)end_ref + 3] = uVar28;
          iVar1 = end_ref + 1;
        }
        for (end_query = 0; end_query < local_aa8; end_query = end_query + 4) {
          vOpen[1] = auVar9._4_8_;
          vNH[0]._0_4_ = uVar28;
          vWH[1] = vOpen[1];
          vNH[0]._4_4_ = 0;
          vWH[0]._4_4_ = 0;
          vE[0] = uVar11;
          vF[1] = uVar10;
          vF[0] = uVar11;
          vJ[1] = uVar10;
          vJ[0] = 0xffffffff;
          piVar5 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_abc = s2B[end_query];
          }
          else {
            if (end_query < local_aa8) {
              local_ac0 = end_query;
            }
            else {
              local_ac0 = local_aa8 + -1;
            }
            local_abc = local_ac0;
          }
          piVar6 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_ad4 = s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_aa8) {
              local_ad8 = end_query + 1;
            }
            else {
              local_ad8 = local_aa8 + -1;
            }
            local_ad4 = local_ad8;
          }
          piVar7 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_aec = s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_aa8) {
              local_af0 = end_query + 2;
            }
            else {
              local_af0 = local_aa8 + -1;
            }
            local_aec = local_af0;
          }
          piVar8 = matrix->matrix;
          iVar4 = matrix->size;
          if (matrix->type == 0) {
            local_b04 = s2B[end_query + 3];
          }
          else if (end_query + 3 < local_aa8) {
            in_stack_fffffffffffff4f8 = end_query + 3;
            local_b04 = in_stack_fffffffffffff4f8;
          }
          else {
            in_stack_fffffffffffff4f8 = local_aa8 + -1;
            local_b04 = in_stack_fffffffffffff4f8;
          }
          iStack_100 = (int)vILimit[0];
          iStack_fc = (int)((ulong)vILimit[0] >> 0x20);
          local_118 = (int)vJreset[1];
          iStack_114 = (int)((ulong)vJreset[1] >> 0x20);
          iStack_110 = (int)vI[0];
          iStack_10c = (int)((ulong)vI[0] >> 0x20);
          matrow0 = (int *)0xfffffffefffffffd;
          vE[1]._0_4_ = uVar28;
          vE[1]._4_4_ = uVar28;
          vWH[0]._0_4_ = uVar28;
          for (end_ref = 0; auVar44 = stack0xfffffffffffff678, end_ref < s2Len + 3;
              end_ref = end_ref + 1) {
            auVar45._4_4_ = vE[1]._4_4_;
            auVar45._0_4_ = (uint)vE[1];
            auVar45._8_4_ = (uint)vWH[0];
            auVar45._12_4_ = vWH[0]._4_4_;
            stack0xfffffffffffff678 = auVar45._4_12_;
            vNH[0]._4_4_ = ptr_00[(long)end_ref + 3];
            iVar43 = vE[1]._4_4_ - open;
            iVar46 = (uint)vWH[0] - open;
            iVar47 = vWH[0]._4_4_ - open;
            iVar48 = ptr_00[(long)end_ref + 3] - open;
            local_418 = vJ[1]._4_4_;
            iStack_414 = (int)vJ[2];
            iStack_410 = vJ[2]._4_4_;
            local_418 = local_418 - gap;
            iStack_414 = iStack_414 - gap;
            iStack_410 = iStack_410 - gap;
            iVar40 = ptr_01[(long)end_ref + 3] - gap;
            uVar30 = (uint)(iVar43 < local_418) * local_418 | (uint)(iVar43 >= local_418) * iVar43;
            uVar34 = (uint)(iVar46 < iStack_414) * iStack_414 |
                     (uint)(iVar46 >= iStack_414) * iVar46;
            uVar36 = (uint)(iVar47 < iStack_410) * iStack_410 |
                     (uint)(iVar47 >= iStack_410) * iVar47;
            uVar41 = (uint)(iVar48 < iVar40) * iVar40 | (uint)(iVar48 >= iVar40) * iVar48;
            vJ[1] = CONCAT44(uVar34,uVar30);
            vF[0]._0_4_ = uVar36;
            vF[0]._4_4_ = uVar41;
            iVar40 = (uint)vE[1] - open;
            iVar43 = vE[1]._4_4_ - open;
            iVar46 = (uint)vWH[0] - open;
            iVar47 = vWH[0]._4_4_ - open;
            local_458 = (int)vF[1];
            iStack_454 = vF[1]._4_4_;
            iStack_450 = (int)vF[2];
            iStack_44c = vF[2]._4_4_;
            local_458 = local_458 - gap;
            iStack_454 = iStack_454 - gap;
            iStack_450 = iStack_450 - gap;
            iStack_44c = iStack_44c - gap;
            uVar31 = (uint)(iVar40 < local_458) * local_458 | (uint)(iVar40 >= local_458) * iVar40;
            uVar35 = (uint)(iVar43 < iStack_454) * iStack_454 |
                     (uint)(iVar43 >= iStack_454) * iVar43;
            uVar37 = (uint)(iVar46 < iStack_450) * iStack_450 |
                     (uint)(iVar46 >= iStack_450) * iVar46;
            uVar42 = (uint)(iVar47 < iStack_44c) * iStack_44c |
                     (uint)(iVar47 >= iStack_44c) * iVar47;
            vF[1] = CONCAT44(uVar35,uVar31);
            vE[0]._0_4_ = uVar37;
            vE[0]._4_4_ = uVar42;
            local_398 = auVar44._0_4_;
            iStack_394 = auVar44._4_4_;
            iStack_390 = auVar44._8_4_;
            iStack_38c = auVar44._12_4_;
            local_398 = local_398 +
                        piVar8[(long)(iVar4 * local_b04) + (long)ptr[(long)(end_ref + -3) + 3]];
            iStack_394 = iStack_394 +
                         piVar7[(long)(iVar3 * local_aec) + (long)ptr[(long)(end_ref + -2) + 3]];
            iStack_390 = iStack_390 +
                         piVar6[(long)(iVar2 * local_ad4) + (long)ptr[(long)(end_ref + -1) + 3]];
            iStack_38c = iStack_38c +
                         piVar5[(long)(iVar1 * local_abc) + (long)ptr[(long)end_ref + 3]];
            uVar31 = (local_398 < (int)uVar31) * uVar31 |
                     (uint)(local_398 >= (int)uVar31) * local_398;
            uVar35 = (iStack_394 < (int)uVar35) * uVar35 |
                     (uint)(iStack_394 >= (int)uVar35) * iStack_394;
            uVar37 = (iStack_390 < (int)uVar37) * uVar37 |
                     (uint)(iStack_390 >= (int)uVar37) * iStack_390;
            uVar42 = (iStack_38c < (int)uVar42) * uVar42 |
                     (uint)(iStack_38c >= (int)uVar42) * iStack_38c;
            uVar30 = ((int)uVar31 < (int)uVar30) * uVar30 | ((int)uVar31 >= (int)uVar30) * uVar31;
            uVar34 = ((int)uVar35 < (int)uVar34) * uVar34 | ((int)uVar35 >= (int)uVar34) * uVar35;
            uVar36 = ((int)uVar37 < (int)uVar36) * uVar36 | ((int)uVar37 >= (int)uVar36) * uVar37;
            uVar41 = ((int)uVar42 < (int)uVar41) * uVar41 | ((int)uVar42 >= (int)uVar41) * uVar42;
            local_358 = (int)matrow0;
            iStack_354 = (int)((ulong)matrow0 >> 0x20);
            iStack_350 = (int)vJ[0];
            iStack_34c = (int)((ulong)vJ[0] >> 0x20);
            uVar31 = -(uint)(local_358 == -1);
            uVar35 = -(uint)(iStack_354 == -1);
            uVar37 = -(uint)(iStack_350 == -1);
            uVar42 = -(uint)(iStack_34c == -1);
            vE[1]._0_4_ = (uVar31 ^ 0xffffffff) & (-1 < (int)uVar30) * uVar30;
            vE[1]._4_4_ = (uVar35 ^ 0xffffffff) & (-1 < (int)uVar34) * uVar34;
            vWH[0]._0_4_ = (uVar37 ^ 0xffffffff) & (-1 < (int)uVar36) * uVar36;
            vWH[0]._4_4_ = (uVar42 ^ 0xffffffff) & (-1 < (int)uVar41) * uVar41;
            auVar24._4_4_ = uVar35;
            auVar24._0_4_ = uVar31;
            auVar24._12_4_ = uVar42;
            auVar24._8_4_ = uVar37;
            auVar26._8_8_ = vF[0];
            auVar26._0_8_ = vJ[1];
            auVar25._8_8_ = uVar11;
            auVar25._0_8_ = uVar10;
            register0x00001240 = pblendvb(auVar26,auVar25,auVar24);
            auVar44._4_4_ = uVar35;
            auVar44._0_4_ = uVar31;
            auVar44._12_4_ = uVar42;
            auVar44._8_4_ = uVar37;
            auVar23._8_8_ = vE[0];
            auVar23._0_8_ = vF[1];
            auVar22._8_8_ = uVar11;
            auVar22._0_8_ = uVar10;
            register0x00001240 = pblendvb(auVar23,auVar22,auVar44);
            if (3 < end_ref) {
              local_1c8 = (int)vSaturationCheckMax[1];
              iStack_1c4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_1c0 = (int)vSaturationCheckMin[0];
              iStack_1bc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              vSaturationCheckMax[1] =
                   CONCAT44(((int)vE[1]._4_4_ < iStack_1c4) * vE[1]._4_4_ |
                            (uint)((int)vE[1]._4_4_ >= iStack_1c4) * iStack_1c4,
                            ((int)(uint)vE[1] < local_1c8) * (uint)vE[1] |
                            (uint)((int)(uint)vE[1] >= local_1c8) * local_1c8);
              vSaturationCheckMin[0] =
                   CONCAT44(((int)vWH[0]._4_4_ < iStack_1bc) * vWH[0]._4_4_ |
                            (uint)((int)vWH[0]._4_4_ >= iStack_1bc) * iStack_1bc,
                            ((int)(uint)vWH[0] < iStack_1c0) * (uint)vWH[0] |
                            (uint)((int)(uint)vWH[0] >= iStack_1c0) * iStack_1c0);
              local_518 = (int)vNegInf[1];
              iStack_514 = (int)((ulong)vNegInf[1] >> 0x20);
              iStack_510 = (int)vSaturationCheckMax[0];
              iStack_50c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              vNegInf[1] = CONCAT44((iStack_514 < (int)vE[1]._4_4_) * vE[1]._4_4_ |
                                    (uint)(iStack_514 >= (int)vE[1]._4_4_) * iStack_514,
                                    (local_518 < (int)(uint)vE[1]) * (uint)vE[1] |
                                    (uint)(local_518 >= (int)(uint)vE[1]) * local_518);
              vSaturationCheckMax[0] =
                   CONCAT44((iStack_50c < (int)vWH[0]._4_4_) * vWH[0]._4_4_ |
                            (uint)(iStack_50c >= (int)vWH[0]._4_4_) * iStack_50c,
                            (iStack_510 < (int)(uint)vWH[0]) * (uint)vWH[0] |
                            (uint)(iStack_510 >= (int)(uint)vWH[0]) * iStack_510);
            }
            vWH_00[0] = (ulong)(uint)end_query;
            vWH_00[1]._0_4_ = local_aa8;
            vWH_00[1]._4_4_ = 0;
            arr_store_si128(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,vWH_00,
                            end_ref,s2Len,j_00,in_stack_fffffffffffff4f8);
            ptr_00[(long)(end_ref + -3) + 3] = (uint)vE[1];
            ptr_01[(long)(end_ref + -3) + 3] = (int32_t)vJ[1];
            uVar32 = CONCAT44(-(uint)(-1 < (long)matrow0),-(uint)(-1 < local_358)) &
                     CONCAT44(-(uint)(iStack_354 < s2Len),-(uint)(local_358 < s2Len)) &
                     CONCAT44(-(uint)(iStack_114 < local_aa8),-(uint)(local_118 < local_aa8));
            uVar38 = CONCAT44(-(uint)(-1 < vJ[0]),-(uint)(-1 < iStack_350)) &
                     CONCAT44(-(uint)(iStack_34c < s2Len),-(uint)(iStack_350 < s2Len)) &
                     CONCAT44(-(uint)(iStack_10c < iStack_fc),-(uint)(iStack_110 < iStack_100));
            local_388 = (uint)vEndI[1];
            uStack_384 = vEndI[1]._4_4_;
            uStack_380 = (uint)vEndI[2];
            uStack_37c = vEndI[2]._4_4_;
            uVar33 = CONCAT44(-(uint)((int)uStack_384 < (int)vE[1]._4_4_),
                              -(uint)((int)local_388 < (int)(uint)vE[1])) & uVar32;
            uVar39 = CONCAT44(-(uint)((int)uStack_37c < (int)vWH[0]._4_4_),
                              -(uint)((int)uStack_380 < (int)(uint)vWH[0])) & uVar38;
            local_c8 = (int)vILimit[1];
            iStack_c4 = vILimit[1]._4_4_;
            iStack_c0 = (int)vILimit[2];
            iStack_bc = vILimit[2]._4_4_;
            auVar21._4_4_ = vE[1]._4_4_;
            auVar21._0_4_ = (uint)vE[1];
            auVar21._12_4_ = vWH[0]._4_4_;
            auVar21._8_4_ = (uint)vWH[0];
            auVar20._8_8_ = uVar39;
            auVar20._0_8_ = uVar33;
            register0x00001240 = pblendvb(stack0xfffffffffffff6c8,auVar21,auVar20);
            auVar19._8_8_ = vI[0];
            auVar19._0_8_ = vJreset[1];
            auVar18._8_8_ = uVar39;
            auVar18._0_8_ = uVar33;
            auVar44 = pblendvb(stack0xfffffffffffff6b8,auVar19,auVar18);
            auVar17._8_8_ = vJ[0];
            auVar17._0_8_ = matrow0;
            auVar16._8_8_ = uVar39;
            auVar16._0_8_ = uVar33;
            auVar45 = pblendvb(stack0xfffffffffffff6a8,auVar17,auVar16);
            uVar32 = CONCAT44(-(uint)(iStack_354 < iStack_c4),-(uint)(local_358 < local_c8)) &
                     CONCAT44(-(uint)(vE[1]._4_4_ == uStack_384),-(uint)((uint)vE[1] == local_388))
                     & uVar32;
            uVar38 = CONCAT44(-(uint)(iStack_34c < iStack_bc),-(uint)(iStack_350 < iStack_c0)) &
                     CONCAT44(-(uint)(vWH[0]._4_4_ == uStack_37c),
                              -(uint)((uint)vWH[0] == uStack_380)) & uVar38;
            auVar15._8_8_ = vI[0];
            auVar15._0_8_ = vJreset[1];
            auVar14._8_8_ = uVar38;
            auVar14._0_8_ = uVar32;
            register0x00001240 = pblendvb(auVar44,auVar15,auVar14);
            auVar13._8_8_ = vJ[0];
            auVar13._0_8_ = matrow0;
            auVar12._8_8_ = uVar38;
            auVar12._0_8_ = uVar32;
            register0x00001240 = pblendvb(auVar45,auVar13,auVar12);
            matrow0 = (int *)CONCAT44(iStack_354 + 1,local_358 + 1);
            vJ[0] = CONCAT44(iStack_34c + 1,iStack_350 + 1);
          }
          vJreset[1] = CONCAT44(iStack_114 + 4,local_118 + 4);
          vI[0] = CONCAT44(iStack_10c + 4,iStack_110 + 4);
        }
        i_1 = (int32_t *)(vEndI + 1);
        j_1 = (int32_t *)(vEndJ + 1);
        plStack_aa0 = vILimit + 1;
        local_83c = uVar28;
        for (local_aa4 = 0; local_aa4 < 4; local_aa4 = local_aa4 + 1) {
          if ((int)local_83c < *i_1) {
            local_83c = *i_1;
            NEG_LIMIT = *j_1;
            POS_LIMIT = (int32_t)*plStack_aa0;
          }
          else if (*i_1 == local_83c) {
            if ((int)*plStack_aa0 < POS_LIMIT) {
              NEG_LIMIT = *j_1;
              POS_LIMIT = (int32_t)*plStack_aa0;
            }
            else if (((int)*plStack_aa0 == POS_LIMIT) && (*j_1 < NEG_LIMIT)) {
              NEG_LIMIT = *j_1;
              POS_LIMIT = (int32_t)*plStack_aa0;
            }
          }
          i_1 = i_1 + 1;
          j_1 = j_1 + 1;
          plStack_aa0 = (longlong *)((long)plStack_aa0 + 4);
        }
        local_b8 = (int)vSaturationCheckMax[1];
        iStack_b4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_b0 = (int)vSaturationCheckMin[0];
        iStack_ac = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_88 = (int)vNegInf[1];
        iStack_84 = (int)((ulong)vNegInf[1] >> 0x20);
        iStack_80 = (int)vSaturationCheckMax[0];
        iStack_7c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar33 = CONCAT44(-(uint)(iStack_ac < (int)uVar28),-(uint)(iStack_b0 < (int)uVar28)) |
                 CONCAT44(-(uint)(iVar29 < iStack_7c),-(uint)(iVar29 < iStack_80));
        auVar27._8_8_ = uVar33;
        auVar27._0_8_ =
             CONCAT44(-(uint)(iStack_b4 < (int)uVar28),-(uint)(local_b8 < (int)uVar28)) |
             CONCAT44(-(uint)(iVar29 < iStack_84),-(uint)(iVar29 < local_88));
        if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar33 >> 7 & 1) != 0) || (uVar33 >> 0xf & 1) != 0) || (uVar33 >> 0x17 & 1) != 0)
               || (uVar33 >> 0x1f & 1) != 0) || (uVar33 >> 0x27 & 1) != 0) ||
             (uVar33 >> 0x2f & 1) != 0) || (uVar33 >> 0x37 & 1) != 0) || (long)uVar33 < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_83c = 0;
          NEG_LIMIT = 0;
          POS_LIMIT = 0;
        }
        ((parasail_result_t *)_s1_local)->score = local_83c;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = POS_LIMIT;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vJLimit = _mm_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            vWH = _mm_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi32(vJ, vNegOne),
                        _mm_cmplt_epi32(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi32(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi32(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi32(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}